

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::writeVertexInputValueSfloat
               (deUint8 *destPtr,VkFormat format,int componentNdx,float value)

{
  deFloat16 local_2a;
  deUint8 *pdStack_28;
  deFloat16 f16;
  deUint8 *destFormatPtr;
  deUint32 componentSize;
  float value_local;
  int componentNdx_local;
  VkFormat format_local;
  deUint8 *destPtr_local;
  
  destFormatPtr._4_4_ = value;
  componentSize = componentNdx;
  value_local = (float)format;
  _componentNdx_local = destPtr;
  destFormatPtr._0_4_ = getVertexFormatComponentSize(format);
  pdStack_28 = _componentNdx_local + (deUint32)destFormatPtr * componentSize;
  if ((deUint32)destFormatPtr == 2) {
    local_2a = deFloat32To16(destFormatPtr._4_4_);
    ::deMemcpy(pdStack_28,&local_2a,2);
  }
  else if ((deUint32)destFormatPtr == 4) {
    ::deMemcpy(pdStack_28,(void *)((long)&destFormatPtr + 4),4);
  }
  return;
}

Assistant:

void writeVertexInputValueSfloat (deUint8* destPtr, VkFormat format, int componentNdx, float value)
{
	const deUint32	componentSize	= getVertexFormatComponentSize(format);
	deUint8*		destFormatPtr	= ((deUint8*)destPtr) + componentSize * componentNdx;

	switch (componentSize)
	{
		case 2:
		{
			deFloat16 f16 = deFloat32To16(value);
			deMemcpy(destFormatPtr, &f16, sizeof(f16));
			break;
		}

		case 4:
			deMemcpy(destFormatPtr, &value, sizeof(value));
			break;

		default:
			DE_ASSERT(false);
	}
}